

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

Vec_Int_t * Acb_NtkCollectCopies(Acb_Ntk_t *p,Gia_Man_t *pGia,Vec_Ptr_t **pvNodesR)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *__ptr;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  void **__s;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  char *__dest;
  int iVar8;
  uint uVar9;
  long lVar10;
  
  __ptr = Acb_NtkFindNodes2(p);
  iVar1 = (p->vObjType).nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar1 - 2U) {
    iVar8 = iVar1 + -1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar8;
  if (iVar8 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar8 << 2);
  }
  p_00->pArray = piVar3;
  iVar1 = pGia->nObjs;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < iVar1 - 1U) {
    iVar8 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar8;
  if (iVar8 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar8 << 3);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar1;
  memset(__s,0,(long)iVar1 << 3);
  iVar1 = __ptr->nSize;
  if (0 < (long)iVar1) {
    piVar3 = __ptr->pArray;
    lVar10 = 0;
    do {
      iVar8 = piVar3[lVar10];
      lVar5 = (long)iVar8;
      if (lVar5 < 1) {
        pcVar6 = "i>0";
LAB_00387354:
        __assert_fail(pcVar6,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
      }
      iVar2 = (p->vObjCopy).nSize;
      if (iVar2 < 1) {
        pcVar6 = "Acb_NtkHasObjCopies(p)";
        goto LAB_00387354;
      }
      if (iVar2 <= iVar8) {
LAB_00387325:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar9 = (p->vObjCopy).pArray[lVar5];
      if (-1 < (int)uVar9) {
        uVar9 = uVar9 >> 1;
        if (pGia->nObjs <= (int)uVar9) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(pGia->pObjs + uVar9) & 0x1fffffff) != 0 &&
            -1 < (int)*(uint *)(pGia->pObjs + uVar9)) {
          if (pVVar4->nSize <= (int)uVar9) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (pVVar4->pArray[uVar9] == (void *)0x0) {
            iVar2 = (p->vObjName).nSize;
            if (iVar2 < 1) {
              __assert_fail("Acb_NtkHasObjNames(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                            ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
            }
            if (iVar2 <= iVar8) goto LAB_00387325;
            pcVar6 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[lVar5]);
            if (pcVar6 == (char *)0x0) {
              __dest = (char *)0x0;
            }
            else {
              sVar7 = strlen(pcVar6);
              __dest = (char *)malloc(sVar7 + 1);
              strcpy(__dest,pcVar6);
            }
            if (pVVar4->nSize <= (int)uVar9) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            pVVar4->pArray[uVar9] = __dest;
            Vec_IntPush(p_00,uVar9);
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (iVar1 != lVar10);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  qsort(p_00->pArray,(long)p_00->nSize,4,Vec_IntSortCompare1);
  *pvNodesR = pVVar4;
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkCollectCopies( Acb_Ntk_t * p, Gia_Man_t * pGia, Vec_Ptr_t ** pvNodesR )
{
    int i, iObj, iLit;
    Vec_Int_t * vObjs   = Acb_NtkFindNodes2( p );
    Vec_Int_t * vNodes  = Vec_IntAlloc( Acb_NtkObjNum(p) );
    Vec_Ptr_t * vNodesR = Vec_PtrStart( Gia_ManObjNum(pGia) );
    Vec_IntForEachEntry( vObjs, iObj, i )
        if ( (iLit = Acb_ObjCopy(p, iObj)) >= 0 && Gia_ObjIsAnd(Gia_ManObj(pGia, Abc_Lit2Var(iLit))) )
        {
            if ( Vec_PtrEntry(vNodesR, Abc_Lit2Var(iLit)) == NULL )
            {
                Vec_PtrWriteEntry( vNodesR, Abc_Lit2Var(iLit), Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
                Vec_IntPush( vNodes, Abc_Lit2Var(iLit) );
            }
        }
    Vec_IntFree( vObjs );
    Vec_IntSort( vNodes, 0 );
    *pvNodesR = vNodesR;
    return vNodes;
}